

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<int,_Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<int>(BaseDictionary<int,_Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *this,int *key,IDiagObjectAddress **value)

{
  Type piVar1;
  hash_t hVar2;
  Type pSVar3;
  uint uVar4;
  uint depth;
  
  piVar1 = this->buckets;
  depth = 0;
  if (piVar1 != (Type)0x0) {
    hVar2 = PrimePolicy::ModPrime(*key & 0x7fffffff,this->bucketCount,this->modFunctionIndex);
    uVar4 = piVar1[hVar2];
    depth = 0;
    if (-1 < (int)uVar4) {
      pSVar3 = this->entries;
      depth = 0;
      do {
        if (pSVar3[uVar4].
            super_DefaultHashedEntry<int,_Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_Js::IDiagObjectAddress_*>.
            super_ValueEntry<Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>_>
            .super_KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>.key == *key) {
          if (this->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(this->stats,depth);
            pSVar3 = this->entries;
          }
          *value = pSVar3[uVar4].
                   super_DefaultHashedEntry<int,_Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<int,_Js::IDiagObjectAddress_*>.
                   super_ValueEntry<Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>_>
                   .super_KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>.value;
          return true;
        }
        depth = depth + 1;
        uVar4 = pSVar3[uVar4].
                super_DefaultHashedEntry<int,_Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<int,_Js::IDiagObjectAddress_*>.
                super_ValueEntry<Js::IDiagObjectAddress_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>_>
                .super_KeyValueEntryDataLayout2<int,_Js::IDiagObjectAddress_*>.next;
      } while (-1 < (int)uVar4);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }